

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::dump_backtrace_(logger *this)

{
  bool bVar1;
  logger *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string_view<char> *in_stack_fffffffffffffea0;
  basic_string_view<char> *this_00;
  basic_string_view<char> *in_stack_fffffffffffffea8;
  basic_string_view<char> *this_01;
  backtracer *in_stack_fffffffffffffeb0;
  function<void_(const_spdlog::details::log_msg_&)> *in_stack_fffffffffffffed8;
  backtracer *in_stack_fffffffffffffee0;
  level_enum in_stack_ffffffffffffff0c;
  log_msg *in_stack_ffffffffffffff10;
  string_view_t in_stack_ffffffffffffff18;
  string_view_t in_stack_ffffffffffffff28;
  function<void_(const_spdlog::details::log_msg_&)> local_a8 [2];
  basic_string_view<char> local_68 [6];
  
  bVar1 = details::backtracer::enabled((backtracer *)0x6b1215);
  if ((bVar1) && (bVar1 = details::backtracer::empty(in_stack_fffffffffffffeb0), !bVar1)) {
    name_abi_cxx11_(in_RDI);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    ::fmt::v11::basic_string_view<char>::basic_string_view
              (in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0);
    this_00 = local_68;
    details::log_msg::log_msg
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff28,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff18);
    (*in_RDI->_vptr_logger[3])(in_RDI,this_00);
    this_01 = (basic_string_view<char> *)&in_RDI->tracer_;
    std::function<void(spdlog::details::log_msg_const&)>::
    function<spdlog::logger::dump_backtrace_()::__0,void>
              (local_a8,(anon_class_8_1_8991fb9c *)this_01);
    details::backtracer::foreach_pop(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::function<void_(const_spdlog::details::log_msg_&)>::~function
              ((function<void_(const_spdlog::details::log_msg_&)> *)0x6b12fd);
    name_abi_cxx11_(in_RDI);
    ::fmt::v11::basic_string_view<char>::
    basic_string_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (this_00,in_stack_fffffffffffffe98);
    ::fmt::v11::basic_string_view<char>::basic_string_view(this_01,(char *)this_00);
    details::log_msg::log_msg
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff28,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff18);
    (*in_RDI->_vptr_logger[3])(in_RDI,&stack0xfffffffffffffee0);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::dump_backtrace_() {
    using details::log_msg;
    if (tracer_.enabled() && !tracer_.empty()) {
        sink_it_(
            log_msg{name(), level::info, "****************** Backtrace Start ******************"});
        tracer_.foreach_pop([this](const log_msg &msg) { this->sink_it_(msg); });
        sink_it_(
            log_msg{name(), level::info, "****************** Backtrace End ********************"});
    }
}